

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aeskey.c
# Opt level: O1

int aes_encrypt_key(uchar *key,int key_len,aes_encrypt_ctx *cx)

{
  if (key_len < 0x80) {
    if (key_len == 0x10) {
LAB_00276a3c:
      aes_encrypt_key128(key,cx);
      return 0;
    }
    if (key_len == 0x18) {
LAB_00276a50:
      aes_encrypt_key192(key,cx);
      return 0;
    }
    if (key_len != 0x20) {
      return 1;
    }
  }
  else if (key_len != 0x100) {
    if (key_len == 0xc0) goto LAB_00276a50;
    if (key_len != 0x80) {
      return 1;
    }
    goto LAB_00276a3c;
  }
  aes_encrypt_key256(key,cx);
  return 0;
}

Assistant:

AES_RETURN aes_encrypt_key(const unsigned char *key, int key_len, aes_encrypt_ctx cx[1])
{
	switch(key_len)
	{
	case 16: case 128: return aes_encrypt_key128(key, cx);
	case 24: case 192: return aes_encrypt_key192(key, cx);
	case 32: case 256: return aes_encrypt_key256(key, cx);
	default: return EXIT_FAILURE;
	}
}